

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# spxchangebasis.hpp
# Opt level: O2

void __thiscall soplex::SPxBasisBase<double>::removedCol(SPxBasisBase<double> *this,int i)

{
  Representation RVar1;
  SPxSolverBase<double> *pSVar2;
  Status *pSVar3;
  SPxId *pSVar4;
  SVectorBase<double> *pSVar5;
  uint uVar6;
  SPxId id;
  SPxColId local_38;
  
  RVar1 = this->theLP->theRep;
  if (RVar1 == COLUMN) {
    if ((this->thedesc).colstat.data[i] < D_FREE) goto LAB_001cc4d1;
  }
  else {
    this->factorized = false;
    if (0 < RVar1 * (this->thedesc).colstat.data[i]) {
      if (NO_PROBLEM < this->thestatus) {
        for (uVar6 = (this->theLP->thecovectors->set).thenum; -1 < (int)uVar6; uVar6 = uVar6 - 1) {
          id.super_DataKey = (this->theBaseId).data[uVar6].super_DataKey;
          if ((0 < id.super_DataKey.info) &&
             (pSVar2 = this->theLP, SPxColId::SPxColId(&local_38,&id),
             (pSVar2->super_SPxLPBase<double>).super_LPColSetBase<double>.super_SVSetBase<double>.
             set.theitem[local_38.super_DataKey.idx].info < 0)) {
            pSVar4 = (this->theBaseId).data;
            pSVar4[uVar6].super_DataKey =
                 pSVar4[(this->theLP->thecovectors->set).thenum].super_DataKey;
            if ((this->matrixIsSetup == true) &&
               ((int)uVar6 < (this->theLP->thecovectors->set).thenum)) {
              pSVar5 = SPxSolverBase<double>::vector(this->theLP,(this->theBaseId).data + uVar6);
              (this->matrix).data[uVar6] = pSVar5;
            }
            break;
          }
        }
      }
      goto LAB_001cc4d1;
    }
  }
  setStatus(this,NO_PROBLEM);
LAB_001cc4d1:
  pSVar3 = (this->thedesc).colstat.data;
  pSVar3[i] = pSVar3[(this->theLP->super_SPxLPBase<double>).super_LPColSetBase<double>.
                     super_SVSetBase<double>.set.thenum];
  reDim(this);
  return;
}

Assistant:

void SPxBasisBase<R>::removedCol(int i)
{
   assert(status() > NO_PROBLEM);
   assert(theLP != nullptr);

   if(theLP->rep() == SPxSolverBase<R>::COLUMN)
   {
      if(theLP->isBasic(thedesc.colStatus(i)))
         setStatus(NO_PROBLEM);
   }
   else
   {
      assert(theLP->rep() == SPxSolverBase<R>::ROW);
      factorized = false;

      if(!theLP->isBasic(thedesc.colStatus(i)))
         setStatus(NO_PROBLEM);
      else if(status() > NO_PROBLEM)
      {
         for(int j = theLP->dim(); j >= 0; --j)
         {
            SPxId id = baseId(j);

            if(id.isSPxColId() && !theLP->has(SPxColId(id)))
            {
               baseId(j) = baseId(theLP->dim());

               if(matrixIsSetup &&
                     j < theLP->dim())
                  matrix[j] = &theLP->vector(baseId(j));

               break;
            }
         }
      }
   }

   thedesc.colStatus(i) = thedesc.colStatus(theLP->nCols());
   reDim();
}